

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9CsvConsumer(char *zToken,int nTokenLen,void *pUserData)

{
  char cVar1;
  char *pcVar2;
  ushort **ppuVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  char *pcVar7;
  jx9_value sEntry;
  SyString local_80;
  jx9_value local_70;
  
  uVar6 = nTokenLen - 1;
  pcVar2 = zToken + 1;
  local_80.zString = zToken;
  local_80.nByte = nTokenLen;
  for (uVar5 = (ulong)(uint)nTokenLen; pcVar7 = pcVar2, uVar4 = (uint)uVar5, uVar4 != 0;
      uVar5 = uVar5 - 1) {
    cVar1 = pcVar7[-1];
    if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
       ((cVar1 != '\0' &&
        (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) == 0)))
       ) break;
    uVar6 = uVar6 - 1;
    pcVar2 = pcVar7 + 1;
    local_80.zString = pcVar7;
  }
  while( true ) {
    local_80.nByte = uVar4;
    if (uVar5 == 0) {
      return 0;
    }
    cVar1 = pcVar7[(ulong)uVar6 - 1];
    if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
       ((cVar1 != '\0' &&
        (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) == 0)))
       ) break;
    uVar6 = uVar6 - 1;
    uVar5 = uVar5 - 1;
    uVar4 = local_80.nByte;
  }
  local_80.nByte = (uint)uVar5;
  jx9MemObjInitFromString(*(jx9_vm **)((long)pUserData + 0x10),&local_70,&local_80);
  jx9_array_add_elem((jx9_value *)pUserData,(jx9_value *)0x0,&local_70);
  jx9MemObjRelease(&local_70);
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9CsvConsumer(const char *zToken, int nTokenLen, void *pUserData)
{
	jx9_value *pArray = (jx9_value *)pUserData;
	jx9_value sEntry;
	SyString sToken;
	/* Insert the token in the given array */
	SyStringInitFromBuf(&sToken, zToken, nTokenLen);
	/* Remove trailing and leading white spcaces and null bytes */
	SyStringFullTrimSafe(&sToken);
	if( sToken.nByte < 1){
		return SXRET_OK;
	}
	jx9MemObjInitFromString(pArray->pVm, &sEntry, &sToken);
	jx9_array_add_elem(pArray, 0, &sEntry);
	jx9MemObjRelease(&sEntry);
	return SXRET_OK;
}